

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,float,bool> *this,
          long call)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  
  puVar2 = *(undefined8 **)(call + 8);
  uVar1 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x20) = *puVar2;
  bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 8),(PyObject *)puVar2[1],
                     SUB41((uVar1 & 2) >> 1,0));
  if (bVar3) {
    bVar3 = type_caster<float,_void>::load
                      ((type_caster<float,_void> *)(this + 4),
                       *(PyObject **)(*(long *)(call + 8) + 0x10),
                       SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
    if (bVar3) {
      bVar3 = type_caster<bool,_void>::load
                        ((type_caster<bool,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x18),
                         SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }